

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcheckbox.cpp
# Opt level: O2

bool __thiscall QCheckBox::event(QCheckBox *this,QEvent *e)

{
  bool bVar1;
  
  if (*(short *)(e + 8) == 100) {
    QWidgetPrivate::setLayoutItemMargins
              (*(QWidgetPrivate **)&(this->super_QAbstractButton).super_QWidget.field_0x8,
               SE_CheckBoxLayoutItem,(QStyleOption *)0x0);
  }
  bVar1 = QAbstractButton::event(&this->super_QAbstractButton,e);
  return bVar1;
}

Assistant:

bool QCheckBox::event(QEvent *e)
{
    Q_D(QCheckBox);
    if (e->type() == QEvent::StyleChange
#ifdef Q_OS_MAC
            || e->type() == QEvent::MacSizeChange
#endif
            )
        d->setLayoutItemMargins(QStyle::SE_CheckBoxLayoutItem);
    return QAbstractButton::event(e);
}